

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_encoder.cc
# Opt level: O3

Status * __thiscall
draco::MeshSequentialEncoder::EncodeConnectivity
          (Status *__return_storage_ptr__,MeshSequentialEncoder *this)

{
  uint uVar1;
  Mesh *pMVar2;
  EncoderOptions *this_00;
  EncoderBuffer *pEVar3;
  pointer paVar4;
  bool bVar5;
  long lVar6;
  uint val;
  ulong uVar7;
  string local_58;
  Status *local_38;
  
  pMVar2 = (this->super_MeshEncoder).mesh_;
  uVar7 = ((long)(pMVar2->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pMVar2->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  val = (uint)uVar7;
  local_38 = __return_storage_ptr__;
  EncodeVarint<unsigned_int>(val,(this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  EncodeVarint<unsigned_int>
            ((((this->super_MeshEncoder).mesh_)->super_PointCloud).num_points_,
             (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  this_00 = (this->super_MeshEncoder).super_PointCloudEncoder.options_;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"compress_connectivity","");
  bVar5 = Options::GetBool((Options *)this_00,&local_58,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
  if (bVar5) {
    local_58._M_dataplus._M_p = (pointer)((ulong)local_58._M_dataplus._M_p._1_7_ << 8);
    if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar3,
                 (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_58,
                 (undefined1 *)((long)&local_58._M_dataplus._M_p + 1));
    }
    CompressAndEncodeIndices(this);
  }
  else {
    local_58._M_dataplus._M_p._0_1_ = 1;
    if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar3,
                 (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_58,
                 (undefined1 *)((long)&local_58._M_dataplus._M_p + 1));
    }
    uVar1 = (((this->super_MeshEncoder).mesh_)->super_PointCloud).num_points_;
    if (uVar1 < 0x100) {
      if (val != 0) {
        lVar6 = 0;
        do {
          pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
          paVar4 = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_58._M_dataplus._M_p._0_1_ =
               *(undefined1 *)((long)&paVar4->_M_elems[0].value_ + lVar6);
          if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar3,
                       (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_58,
                       (undefined1 *)((long)&local_58._M_dataplus._M_p + 1));
            pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
            local_58._M_dataplus._M_p._0_1_ = *(undefined1 *)((long)(paVar4->_M_elems + 1) + lVar6);
            if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
              std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                        ((vector<char,std::allocator<char>> *)pEVar3,
                         (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_58,
                         (undefined1 *)((long)&local_58._M_dataplus._M_p + 1));
              pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
              local_58._M_dataplus._M_p._0_1_ =
                   *(undefined1 *)((long)(paVar4->_M_elems + 2) + lVar6);
              if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
                std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                          ((vector<char,std::allocator<char>> *)pEVar3,
                           (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_58,
                           (undefined1 *)((long)&local_58._M_dataplus._M_p + 1));
              }
            }
          }
          lVar6 = lVar6 + 0xc;
        } while ((uVar7 & 0xffffffff) * 0xc != lVar6);
      }
    }
    else if (uVar1 < 0x10000) {
      if (val != 0) {
        lVar6 = 0;
        do {
          pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
          paVar4 = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_58._M_dataplus._M_p._0_2_ =
               *(undefined2 *)((long)&paVar4->_M_elems[0].value_ + lVar6);
          if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar3,
                       (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_58,
                       (undefined1 *)((long)&local_58._M_dataplus._M_p + 2));
            pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
            local_58._M_dataplus._M_p._0_2_ = *(undefined2 *)((long)(paVar4->_M_elems + 1) + lVar6);
            if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
              std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                        ((vector<char,std::allocator<char>> *)pEVar3,
                         (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_58,
                         (undefined1 *)((long)&local_58._M_dataplus._M_p + 2));
              pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
              local_58._M_dataplus._M_p._0_2_ =
                   *(undefined2 *)((long)(paVar4->_M_elems + 2) + lVar6);
              if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
                std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                          ((vector<char,std::allocator<char>> *)pEVar3,
                           (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl
                           .super__Vector_impl_data._M_finish,&local_58,
                           (undefined1 *)((long)&local_58._M_dataplus._M_p + 2));
              }
            }
          }
          lVar6 = lVar6 + 0xc;
        } while ((uVar7 & 0xffffffff) * 0xc != lVar6);
      }
    }
    else if (uVar1 < 0x200000) {
      if (val != 0) {
        lVar6 = 0;
        do {
          paVar4 = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          EncodeVarint<unsigned_int>
                    (*(uint *)((long)&paVar4->_M_elems[0].value_ + lVar6),
                     (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
          EncodeVarint<unsigned_int>
                    (*(uint *)((long)(paVar4->_M_elems + 1) + lVar6),
                     (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
          EncodeVarint<unsigned_int>
                    (*(uint *)((long)(paVar4->_M_elems + 2) + lVar6),
                     (this->super_MeshEncoder).super_PointCloudEncoder.buffer_);
          lVar6 = lVar6 + 0xc;
        } while ((uVar7 & 0xffffffff) * 0xc != lVar6);
      }
    }
    else if (val != 0) {
      lVar6 = 0;
      do {
        pEVar3 = (this->super_MeshEncoder).super_PointCloudEncoder.buffer_;
        if (pEVar3->bit_encoder_reserved_bytes_ < 1) {
          paVar4 = (((this->super_MeshEncoder).mesh_)->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar3,
                     (pEVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long)&paVar4->_M_elems[0].value_ + lVar6,
                     (long)&paVar4[1]._M_elems[0].value_ + lVar6);
        }
        lVar6 = lVar6 + 0xc;
      } while ((uVar7 & 0xffffffff) * 0xc != lVar6);
    }
  }
  local_38->code_ = OK;
  (local_38->error_msg_)._M_dataplus._M_p = (pointer)&(local_38->error_msg_).field_2;
  (local_38->error_msg_)._M_string_length = 0;
  (local_38->error_msg_).field_2._M_local_buf[0] = '\0';
  return local_38;
}

Assistant:

Status MeshSequentialEncoder::EncodeConnectivity() {
  // Serialize indices.
  const uint32_t num_faces = mesh()->num_faces();
  EncodeVarint(num_faces, buffer());
  EncodeVarint(static_cast<uint32_t>(mesh()->num_points()), buffer());

  // We encode all attributes in the original (possibly duplicated) format.
  if (options()->GetGlobalBool("compress_connectivity", false)) {
    // 0 = Encode compressed indices.
    buffer()->Encode(static_cast<uint8_t>(0));
    if (!CompressAndEncodeIndices()) {
      return Status(Status::DRACO_ERROR, "Failed to compress connectivity.");
    }
  } else {
    // 1 = Encode indices directly.
    buffer()->Encode(static_cast<uint8_t>(1));
    // Store vertex indices using a smallest data type that fits their range.
    if (mesh()->num_points() < 256) {
      // Serialize indices as uint8_t.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(static_cast<uint8_t>(face[0].value()));
        buffer()->Encode(static_cast<uint8_t>(face[1].value()));
        buffer()->Encode(static_cast<uint8_t>(face[2].value()));
      }
    } else if (mesh()->num_points() < (1 << 16)) {
      // Serialize indices as uint16_t.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(static_cast<uint16_t>(face[0].value()));
        buffer()->Encode(static_cast<uint16_t>(face[1].value()));
        buffer()->Encode(static_cast<uint16_t>(face[2].value()));
      }
    } else if (mesh()->num_points() < (1 << 21)) {
      // Serialize indices as varint.
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        EncodeVarint(static_cast<uint32_t>(face[0].value()), buffer());
        EncodeVarint(static_cast<uint32_t>(face[1].value()), buffer());
        EncodeVarint(static_cast<uint32_t>(face[2].value()), buffer());
      }
    } else {
      // Serialize faces as uint32_t (default).
      for (FaceIndex i(0); i < num_faces; ++i) {
        const auto &face = mesh()->face(i);
        buffer()->Encode(face);
      }
    }
  }
  return OkStatus();
}